

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cc
# Opt level: O0

SymbolEntry * __thiscall
Scope::queryProperties(Scope *this,Address *addr,int4 size,Address *usepoint,uint4 *flags)

{
  bool bVar1;
  uint4 uVar2;
  Scope *pSVar3;
  Scope *finalscope;
  Scope *basescope;
  SymbolEntry *res;
  uint4 *flags_local;
  Address *usepoint_local;
  Address *pAStack_18;
  int4 size_local;
  Address *addr_local;
  Scope *this_local;
  
  basescope = (Scope *)0x0;
  res = (SymbolEntry *)flags;
  flags_local = (uint4 *)usepoint;
  usepoint_local._4_4_ = size;
  pAStack_18 = addr;
  addr_local = (Address *)this;
  pSVar3 = Database::mapScope(this->glb->symboltab,this,addr,usepoint);
  pSVar3 = stackContainer(pSVar3,(Scope *)0x0,pAStack_18,usepoint_local._4_4_,(Address *)flags_local
                          ,(SymbolEntry **)&basescope);
  if (basescope == (Scope *)0x0) {
    if (pSVar3 == (Scope *)0x0) {
      uVar2 = Database::getProperty(this->glb->symboltab,pAStack_18);
      *(uint4 *)&res->symbol = uVar2;
    }
    else {
      *(undefined4 *)&res->symbol = 0x410000;
      bVar1 = isGlobal(pSVar3);
      if (bVar1) {
        *(uint *)&res->symbol = *(uint *)&res->symbol | 0x8000;
      }
      uVar2 = Database::getProperty(this->glb->symboltab,pAStack_18);
      *(uint4 *)&res->symbol = uVar2 | *(uint *)&res->symbol;
    }
  }
  else {
    uVar2 = SymbolEntry::getAllFlags((SymbolEntry *)basescope);
    *(uint4 *)&res->symbol = uVar2;
  }
  return (SymbolEntry *)basescope;
}

Assistant:

SymbolEntry *Scope::queryProperties(const Address &addr,int4 size,
				    const Address &usepoint,uint4 &flags) const
{
  SymbolEntry *res = (SymbolEntry *)0;
  const Scope *basescope = glb->symboltab->mapScope(this,addr,usepoint);
  const Scope *finalscope = stackContainer(basescope,(const Scope *)0,addr,size,usepoint,&res);
  if (res != (SymbolEntry *)0) // If we found a symbol
    flags = res->getAllFlags(); // use its flags
  else if (finalscope != (Scope *)0) { // If we found just a scope
    // set flags just based on scope
    flags = Varnode::mapped | Varnode::addrtied;
    if (finalscope->isGlobal())
      flags |= Varnode::persist;
    flags |= glb->symboltab->getProperty(addr);
  }
  else
    flags = glb->symboltab->getProperty(addr);
  return res;
}